

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

int tap_test_died(int status)

{
  int *piVar1;
  int iVar2;
  
  if (tap_test_died::test_died == (int *)0x0) {
    iVar2 = 0;
    piVar1 = (int *)mmap((void *)0x0,4,3,0x21,-1,0);
    tap_test_died::test_died = piVar1;
    *piVar1 = 0;
  }
  else {
    iVar2 = *tap_test_died::test_died;
    piVar1 = tap_test_died::test_died;
  }
  *piVar1 = status;
  return iVar2;
}

Assistant:

int
tap_test_died (int status) {
    static int *test_died = NULL;
    int prev;
    if (!test_died) {
        test_died = mmap(0, sizeof (int), PROT_READ | PROT_WRITE,
                         MAP_SHARED | MAP_ANONYMOUS, -1, 0);
        *test_died = 0;
    }
    prev = *test_died;
    *test_died = status;
    return prev;
}